

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::InternalSwap
          (ArrayFeatureType *this,ArrayFeatureType *other)

{
  ArrayFeatureType *other_local;
  ArrayFeatureType *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->shape_,&other->shape_);
  std::swap<int>(&this->datatype_,&other->datatype_);
  std::swap<CoreML::Specification::ArrayFeatureType::ShapeFlexibilityUnion>
            (&this->ShapeFlexibility_,&other->ShapeFlexibility_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<CoreML::Specification::ArrayFeatureType::DefaultOptionalValueUnion>
            (&this->defaultOptionalValue_,&other->defaultOptionalValue_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ArrayFeatureType::InternalSwap(ArrayFeatureType* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(datatype_, other->datatype_);
  std::swap(ShapeFlexibility_, other->ShapeFlexibility_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(defaultOptionalValue_, other->defaultOptionalValue_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}